

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_178405::DigestTest_Getters_Test::TestBody(DigestTest_Getters_Test *this)

{
  bool bVar1;
  char *pcVar2;
  EVP_MD *rhs;
  EVP_MD *pEVar3;
  ASN1_OBJECT *pAVar4;
  pointer obj_00;
  char *in_R9;
  AssertHelper local_250;
  Message local_248;
  EVP_MD *local_240;
  EVP_MD *local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_10;
  Message local_218;
  EVP_MD *local_210;
  EVP_MD *local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_9;
  Message local_1e8;
  EVP_MD *local_1e0;
  EVP_MD *local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_8;
  string local_1b8;
  AssertHelper local_198;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_;
  UniquePtr<ASN1_OBJECT> obj;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_7;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_6;
  Message local_128;
  EVP_MD *local_120;
  EVP_MD *local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_5;
  Message local_f8;
  EVP_MD *local_f0;
  EVP_MD *local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_4;
  Message local_c8;
  EVP_MD *local_c0;
  EVP_MD *local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  EVP_MD *local_70;
  EVP_MD *local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_38;
  EVP_MD *local_30;
  EVP_MD *local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  DigestTest_Getters_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28 = EVP_sha512();
  local_30 = EVP_get_digestbyname("RSA-SHA512");
  testing::internal::EqHelper::Compare<const_env_md_st_*,_const_env_md_st_*,_nullptr>
            ((EqHelper *)local_20,"EVP_sha512()","EVP_get_digestbyname(\"RSA-SHA512\")",
             (env_md_st **)&local_28,(env_md_st **)&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
               ,0x107,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_68 = EVP_sha512();
  local_70 = EVP_get_digestbyname("sha512WithRSAEncryption");
  testing::internal::EqHelper::Compare<const_env_md_st_*,_const_env_md_st_*,_nullptr>
            ((EqHelper *)local_60,"EVP_sha512()","EVP_get_digestbyname(\"sha512WithRSAEncryption\")"
             ,(env_md_st **)&local_68,(env_md_st **)&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
               ,0x108,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  rhs = EVP_get_digestbyname("nonsense");
  testing::internal::EqHelper::Compare<env_md_st_const>
            ((EqHelper *)local_90,"nullptr","EVP_get_digestbyname(\"nonsense\")",(nullptr_t)0x0,
             (env_md_st *)rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
               ,0x109,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_b8 = EVP_sha512();
  local_c0 = EVP_get_digestbyname("SHA512");
  testing::internal::EqHelper::Compare<const_env_md_st_*,_const_env_md_st_*,_nullptr>
            ((EqHelper *)local_b0,"EVP_sha512()","EVP_get_digestbyname(\"SHA512\")",
             (env_md_st **)&local_b8,(env_md_st **)&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_e8 = EVP_sha512();
  local_f0 = EVP_get_digestbyname("sha512");
  testing::internal::EqHelper::Compare<const_env_md_st_*,_const_env_md_st_*,_nullptr>
            ((EqHelper *)local_e0,"EVP_sha512()","EVP_get_digestbyname(\"sha512\")",
             (env_md_st **)&local_e8,(env_md_st **)&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_118 = EVP_sha512();
  local_120 = EVP_get_digestbynid(0x2a2);
  testing::internal::EqHelper::Compare<const_env_md_st_*,_const_env_md_st_*,_nullptr>
            ((EqHelper *)local_110,"EVP_sha512()","EVP_get_digestbynid(674)",
             (env_md_st **)&local_118,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
               ,0x10d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  pEVar3 = EVP_get_digestbynid(0x29e);
  testing::internal::EqHelper::Compare<env_md_st_const>
            ((EqHelper *)local_140,"nullptr","EVP_get_digestbynid(670)",(nullptr_t)0x0,pEVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
               ,0x10e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  pEVar3 = EVP_get_digestbynid(0);
  testing::internal::EqHelper::Compare<env_md_st_const>
            ((EqHelper *)local_160,"nullptr","EVP_get_digestbynid(0)",(nullptr_t)0x0,pEVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&obj,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
               ,0x10f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&obj,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&obj);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  pAVar4 = OBJ_txt2obj("1.3.14.3.2.26",0);
  std::unique_ptr<asn1_object_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<asn1_object_st,bssl::internal::Deleter> *)&gtest_ar_.message_,
             (pointer)pAVar4);
  testing::AssertionResult::AssertionResult<std::unique_ptr<asn1_object_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_188,
             (unique_ptr<asn1_object_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b8,(internal *)local_188,(AssertionResult *)0x8733ab,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
               ,0x112,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    testing::Message::~Message(&local_190);
  }
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  if (gtest_ar_8.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_1d8 = EVP_sha1();
    obj_00 = std::unique_ptr<asn1_object_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<asn1_object_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_1e0 = EVP_get_digestbyobj(obj_00);
    testing::internal::EqHelper::Compare<const_env_md_st_*,_const_env_md_st_*,_nullptr>
              ((EqHelper *)local_1d0,"EVP_sha1()","EVP_get_digestbyobj(obj.get())",
               (env_md_st **)&local_1d8,&local_1e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
    if (!bVar1) {
      testing::Message::Message(&local_1e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
                 ,0x113,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_1e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
    local_208 = EVP_md5_sha1();
    pAVar4 = OBJ_nid2obj(0x72);
    local_210 = EVP_get_digestbyobj((ASN1_OBJECT *)pAVar4);
    testing::internal::EqHelper::Compare<const_env_md_st_*,_const_env_md_st_*,_nullptr>
              ((EqHelper *)local_200,"EVP_md5_sha1()","EVP_get_digestbyobj(OBJ_nid2obj(114))",
               &local_208,&local_210);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
    if (!bVar1) {
      testing::Message::Message(&local_218);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
                 ,0x114,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_218);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_218);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
    local_238 = EVP_sha1();
    pAVar4 = OBJ_nid2obj(0x40);
    local_240 = EVP_get_digestbyobj((ASN1_OBJECT *)pAVar4);
    testing::internal::EqHelper::Compare<const_env_md_st_*,_const_env_md_st_*,_nullptr>
              ((EqHelper *)local_230,"EVP_sha1()","EVP_get_digestbyobj(OBJ_nid2obj(64))",
               (env_md_st **)&local_238,&local_240);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      testing::Message::Message(&local_248);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
                 ,0x115,pcVar2);
      testing::internal::AssertHelper::operator=(&local_250,&local_248);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      testing::Message::~Message(&local_248);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
    gtest_ar_8.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  std::unique_ptr<asn1_object_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<asn1_object_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(DigestTest, Getters) {
  EXPECT_EQ(EVP_sha512(), EVP_get_digestbyname("RSA-SHA512"));
  EXPECT_EQ(EVP_sha512(), EVP_get_digestbyname("sha512WithRSAEncryption"));
  EXPECT_EQ(nullptr, EVP_get_digestbyname("nonsense"));
  EXPECT_EQ(EVP_sha512(), EVP_get_digestbyname("SHA512"));
  EXPECT_EQ(EVP_sha512(), EVP_get_digestbyname("sha512"));

  EXPECT_EQ(EVP_sha512(), EVP_get_digestbynid(NID_sha512));
  EXPECT_EQ(nullptr, EVP_get_digestbynid(NID_sha512WithRSAEncryption));
  EXPECT_EQ(nullptr, EVP_get_digestbynid(NID_undef));

  bssl::UniquePtr<ASN1_OBJECT> obj(OBJ_txt2obj("1.3.14.3.2.26", 0));
  ASSERT_TRUE(obj);
  EXPECT_EQ(EVP_sha1(), EVP_get_digestbyobj(obj.get()));
  EXPECT_EQ(EVP_md5_sha1(), EVP_get_digestbyobj(OBJ_nid2obj(NID_md5_sha1)));
  EXPECT_EQ(EVP_sha1(), EVP_get_digestbyobj(OBJ_nid2obj(NID_sha1)));
}